

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var Js::JavascriptPromise::EntryRace(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *this;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  JavascriptPromiseCapability *pJVar9;
  RecyclableObject *this_00;
  RecyclableObject *nextFunc;
  JavascriptMethod p_Var10;
  RecyclableObject *this_01;
  int32 hCode;
  int in_stack_00000010;
  undefined1 local_a0 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  RecyclableObject *local_60;
  Var local_58;
  CallInfo local_50;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x292,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00cee5ef;
    *puVar6 = 0;
  }
  __tag.entry.next = (Entry *)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&__tag.entry.next,&local_50);
  if ((local_50._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x293,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00cee5ef:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_a0,function,local_50,L"Promise.race",
             &stack0x00000000);
  pvVar7 = Arguments::operator[]((Arguments *)&__tag.entry.next,0);
  BVar5 = JavascriptOperators::IsObject(pvVar7);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec41,L"Promise.race");
  }
  if (((ulong)__tag.entry.next & 0xfffffe) == 0) {
    pRVar8 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pRVar8 = (RecyclableObject *)Arguments::operator[]((Arguments *)&__tag.entry.next,1);
  }
  pJVar9 = NewPromiseCapability(pvVar7,pSVar1);
  callInfo_local = (CallInfo)VarTo<Js::RecyclableObject>(pvVar7);
  pRVar8 = JavascriptOperators::GetIterator(pRVar8,pSVar1,false);
  pvVar7 = JavascriptOperators::GetProperty
                     ((RecyclableObject *)callInfo_local,0x134,pSVar1,(PropertyValueInfo *)0x0);
  bVar4 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,(PCWSTR)0x0);
  }
  this_00 = VarTo<Js::RecyclableObject>(pvVar7);
  local_58 = (Var)0x0;
  nextFunc = JavascriptOperators::CacheIteratorNext(pRVar8,pSVar1);
  while( true ) {
    bVar4 = JavascriptOperators::IteratorStepAndValue(pRVar8,pSVar1,nextFunc,&local_58);
    pvVar7 = local_58;
    if (!bVar4) {
      pvVar2 = (pJVar9->promise).ptr;
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_a0);
      return pvVar2;
    }
    this = pSVar1->threadContext;
    bVar4 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint(this_00);
    CheckIsExecutable(this_00,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint(this_00);
    pvVar7 = (*p_Var10)(this_00,(CallInfo)this_00,0x2000002,0,0,0,0,0x2000002,callInfo_local,pvVar7)
    ;
    this->reentrancySafeOrHandled = bVar4;
    BVar5 = JavascriptConversion::ToObject(pvVar7,pSVar1,&local_60);
    if (BVar5 == 0) break;
    pvVar7 = JavascriptOperators::GetProperty(local_60,0x169,pSVar1,(PropertyValueInfo *)0x0);
    bVar4 = JavascriptConversion::IsCallable(pvVar7);
    if (!bVar4) {
      hCode = -0x7ff5ec76;
      goto LAB_00cee5dd;
    }
    this_01 = VarTo<Js::RecyclableObject>(pvVar7);
    bVar4 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (this->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var10 = RecyclableObject::GetEntryPoint(this_01);
    CheckIsExecutable(this_01,p_Var10);
    p_Var10 = RecyclableObject::GetEntryPoint(this_01);
    (*p_Var10)(this_01,(CallInfo)this_01,0x2000003,0,0,0,0,0x2000003,local_60,(pJVar9->resolve).ptr,
               (pJVar9->reject).ptr);
    this->reentrancySafeOrHandled = bVar4;
  }
  hCode = -0x7ff5ec71;
LAB_00cee5dd:
  JavascriptError::ThrowTypeError(pSVar1,hCode,(PCWSTR)0x0);
}

Assistant:

Var JavascriptPromise::EntryRace(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.race"));

        // 1. Let C be the this value.
        Var constructor = args[0];

        // 2. If Type(C) is not Object, throw a TypeError exception.
        if (!JavascriptOperators::IsObject(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Promise.race"));
        }

        Var undefinedVar = scriptContext->GetLibrary()->GetUndefined();
        Var iterable;

        if (args.Info.Count > 1)
        {
            iterable = args[1];
        }
        else
        {
            iterable = undefinedVar;
        }

        // 3. Let promiseCapability be NewPromiseCapability(C).
        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(constructor, scriptContext);

        // We know that constructor is an object at this point - further, we even know that it is a constructor - because NewPromiseCapability
        // would throw otherwise. That means we can safely cast constructor into a RecyclableObject* now and avoid having to perform ToObject
        // as part of the Invoke operation performed inside the loop below.
        RecyclableObject* constructorObject = VarTo<RecyclableObject>(constructor);
        JavascriptExceptionObject* exception = nullptr;

        try
        {
            // 4. Let iterator be GetIterator(iterable).
            RecyclableObject* iterator = JavascriptOperators::GetIterator(iterable, scriptContext);

            Var resolveVar = JavascriptOperators::GetProperty(constructorObject, Js::PropertyIds::resolve, scriptContext);
            if (!JavascriptConversion::IsCallable(resolveVar))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
            }

            RecyclableObject* resolveFunc = VarTo<RecyclableObject>(resolveVar);

            JavascriptOperators::DoIteratorStepAndValue(iterator, scriptContext, [&](Var next)
            {
                ThreadContext * threadContext = scriptContext->GetThreadContext();
                Var nextPromise = nullptr;
                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    nextPromise = CALL_FUNCTION(threadContext,
                                    resolveFunc, Js::CallInfo(CallFlags_Value, 2),
                                    constructorObject,
                                    next);
                }
                END_SAFE_REENTRANT_CALL

                RecyclableObject* nextPromiseObject;

                if (!JavascriptConversion::ToObject(nextPromise, scriptContext, &nextPromiseObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
                }

                Var thenVar = JavascriptOperators::GetProperty(nextPromiseObject, Js::PropertyIds::then, scriptContext);

                if (!JavascriptConversion::IsCallable(thenVar))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
                }

                RecyclableObject* thenFunc = VarTo<RecyclableObject>(thenVar);

                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    CALL_FUNCTION(threadContext,
                        thenFunc, Js::CallInfo(CallFlags_Value, 3),
                        nextPromiseObject,
                        promiseCapability->GetResolve(),
                        promiseCapability->GetReject());
                }
                END_SAFE_REENTRANT_CALL

            });
        }
        catch (const JavascriptException& err)
        {
            exception = err.GetAndClear();
        }

        if (exception != nullptr)
        {
            TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        return promiseCapability->GetPromise();
    }